

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
          (cmTargetCollectLinkLanguages *this,cmTarget *target,string *config,
          hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          *languages,cmTarget *head)

{
  _Rb_tree_header *p_Var1;
  cmTarget *local_30;
  
  local_30 = target;
  std::__cxx11::string::string((string *)this,(string *)config);
  this->Languages = languages;
  this->HeadTarget = head;
  this->Makefile = target->Makefile;
  this->Target = target;
  p_Var1 = &(this->Visited)._M_t._M_impl.super__Rb_tree_header;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
  ::_M_insert_unique<cmTarget_const*const&>
            ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
              *)&this->Visited,&local_30);
  return;
}

Assistant:

cmTargetCollectLinkLanguages(cmTarget const* target,
                               const std::string& config,
                               UNORDERED_SET<std::string>& languages,
                               cmTarget const* head):
    Config(config), Languages(languages), HeadTarget(head),
    Makefile(target->GetMakefile()), Target(target)
  { this->Visited.insert(target); }